

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O2

void test_archive_string_conversion(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive_conflict *paVar4;
  FILE *pFVar5;
  size_t sVar6;
  size_t v2;
  char *pcVar7;
  archive_string_conv *paVar8;
  archive_string_conv *paVar9;
  archive_conflict *paVar10;
  archive_string_conv *sc;
  archive_conflict *a;
  char *pcVar11;
  char *pcVar12;
  wchar_t *pwVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  wchar_t *wp;
  archive_string local_8e8;
  archive_string_conv *local_8c8;
  archive_string_conv *local_8c0;
  FILE *local_8b8;
  archive_conflict *local_8b0;
  FILE *local_8a8;
  archive_conflict *local_8a0;
  char *mp;
  archive_string_conv *local_890;
  char nfc [80];
  size_t local_830;
  archive_mstring mstr;
  char nfd [80];
  archive_entry *ae;
  char utf8_nfc [80];
  char utf8_nfd [80];
  wchar_t wc_nfc [40];
  char utf16le_nfd [80];
  char utf16le_nfc [80];
  char utf16be_nfd [80];
  char utf16be_nfc [80];
  wchar_t wc_nfd [40];
  char buff_1 [512];
  char buff [512];
  
  extract_reference_file("test_archive_string_conversion.txt.Z");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͣ',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͤ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_raw((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_archive_string_conversion.txt.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͧ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile, 512)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pFVar5 = fopen("testdata.txt","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͪ',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"w\")) != NULL",
                   (void *)0x0);
  while( true ) {
    sVar6 = archive_read_data((archive *)paVar4,buff,0x200);
    if ((long)sVar6 < 1) break;
    v2 = fwrite(buff,1,sVar6,pFVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,L'ͬ',sVar6,"size",v2,"fwrite(buff, 1, size, fp)",(void *)0x0);
  }
  iVar1 = fclose(pFVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͭ',0,"0",(long)iVar1,"fclose(fp)",(void *)0x0);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͮ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ċ');
    test_skipping(
                 "A test of string normalization for NFC requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8e8.s = (char *)0x0;
    local_8e8.length = 0;
    local_8e8.buffer_length = 0;
    mstr.aes_mbs.s = (char *)0x0;
    mstr.aes_mbs.length = 0;
    mstr.aes_mbs.buffer_length = 0;
    mstr.aes_utf8.s = (char *)0x0;
    mstr.aes_utf8.length = 0;
    mstr.aes_utf8.buffer_length = 0;
    mstr.aes_wcs.s = (wchar_t *)0x0;
    mstr.aes_wcs.length = 0;
    mstr.aes_wcs.buffer_length = 0;
    mstr.aes_mbs_in_locale.s = (char *)0x0;
    mstr.aes_mbs_in_locale.length = 0;
    mstr.aes_mbs_in_locale.buffer_length = 0;
    mstr.aes_set = L'\0';
    mstr._100_4_ = 0;
    paVar4 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ė',(uint)(paVar4 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    paVar8 = archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ę',(uint)(paVar8 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    paVar9 = archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ě',(uint)(paVar9 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    pFVar5 = (FILE *)archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ĝ',(uint)(pFVar5 != (FILE *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar10 = (archive_conflict *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ğ',(uint)(paVar10 != (archive_conflict *)0x0),
                     "(a2 = archive_write_new()) != NULL",(void *)0x0);
    sc = archive_string_conversion_to_charset(paVar10,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ġ',(uint)(sc != (archive_string_conv *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,paVar4);
    auVar15._0_4_ = -(uint)((int)((ulong)paVar8 >> 0x20) == 0 && (int)paVar8 == 0);
    auVar15._4_4_ = -(uint)((int)paVar9 == 0 && (int)((ulong)paVar9 >> 0x20) == 0);
    auVar15._8_4_ = -(uint)((int)((ulong)pFVar5 >> 0x20) == 0 && (int)pFVar5 == 0);
    auVar15._12_4_ = -(uint)((int)sc == 0 && (int)((ulong)sc >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar15);
    if (iVar1 == 0) {
      uVar14 = 1;
      local_8b0 = paVar4;
      local_8a0 = paVar10;
      archive_string_conversion_set_opt(paVar8,L'\x02');
      local_8c8 = paVar9;
      archive_string_conversion_set_opt(paVar9,L'\x02');
      local_8a8 = pFVar5;
      archive_string_conversion_set_opt((archive_string_conv *)pFVar5,L'\x02');
      archive_string_conversion_set_opt(sc,L'\x02');
      local_8b8 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ĭ',(uint)(local_8b8 != (FILE *)0x0),
                       "(fp = fopen(testdata, \"r\")) != NULL",(void *)0x0);
      local_8c0 = sc;
      while( true ) {
        pcVar7 = fgets(buff_1,0x200,local_8b8);
        if (pcVar7 == (char *)0x0) break;
        if (buff_1[0] != '#') {
          pcVar7 = strchr(buff_1,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
            strncpy(nfc,buff_1,0x4f);
            nfc[0x4f] = '\0';
            pcVar11 = strchr(pcVar7 + 1,10);
            if (pcVar11 != (char *)0x0) {
              *pcVar11 = '\0';
              strncpy(nfd,pcVar7 + 1,0x4f);
              nfd[0x4f] = '\0';
              scan_unicode_pattern(utf8_nfc,wc_nfc,utf16be_nfc,utf16le_nfc,nfc,L'\0');
              scan_unicode_pattern(utf8_nfd,wc_nfd,utf16be_nfd,utf16le_nfd,nfd,L'\0');
              sVar6 = strlen(utf8_nfd);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfd,sVar6,paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ť',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ũ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(utf8_nfc);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ů',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ű',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(utf8_nfc);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ŷ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfc, t_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ź',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16be_nfd,100000,local_8c8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƀ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16be_nfd, 100000, f_sconv16be)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƃ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16le_nfd,100000,
                                        (archive_string_conv *)local_8a8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɖ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16le_nfd, 100000, f_sconv16le)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƌ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf8_nfd,100000,paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƛ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfd, 100000, f_sconv8)"
                                  ,(void *)0x0);
              paVar4 = local_8b0;
              wVar2 = archive_mstring_get_wcs(local_8b0,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɲ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ơ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf16be_nfd,100000,local_8c8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ʀ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs(paVar4,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƨ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƫ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16le_nfd,100000,(archive_string_conv *)local_8a8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ʊ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfd, 100000, f_sconv16le)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs(paVar4,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƴ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,(ulong)uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƶ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_wcs(&mstr,wc_nfc);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƽ',0,"0",(long)wVar2,"archive_mstring_copy_wcs(&mstr, wc_nfc)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_mbs_l(paVar4,&mstr,&mp,&local_830,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƾ',0,"0",(long)wVar2,
                                  "archive_mstring_get_mbs_l( a, &mstr, &mp, &mplen, t_sconv8)",
                                  (void *)0x0);
              failure("WCS NFC(%s) should be UTF-8 NFC:%d",nfc,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ǁ',utf8_nfc,"utf8_nfc",mp,"mp",(void *)0x0,L'\x01');
            }
          }
        }
        uVar14 = uVar14 + 1;
      }
      archive_string_free(&local_8e8);
      archive_mstring_clean(&mstr);
      fclose(local_8b8);
      iVar1 = archive_read_free((archive *)local_8b0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'ǈ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free((archive *)local_8a0);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'ǉ';
    }
    else {
      iVar1 = archive_read_free((archive *)paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ĥ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'Ǟ');
    test_skipping(
                 "A test of string normalization for NFD requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8e8.s = (char *)0x0;
    local_8e8.length = 0;
    local_8e8.buffer_length = 0;
    mstr.aes_mbs.s = (char *)0x0;
    mstr.aes_mbs.length = 0;
    mstr.aes_mbs.buffer_length = 0;
    mstr.aes_utf8.s = (char *)0x0;
    mstr.aes_utf8.length = 0;
    mstr.aes_utf8.buffer_length = 0;
    mstr.aes_wcs.s = (wchar_t *)0x0;
    mstr.aes_wcs.length = 0;
    mstr.aes_wcs.buffer_length = 0;
    mstr.aes_mbs_in_locale.s = (char *)0x0;
    mstr.aes_mbs_in_locale.length = 0;
    mstr.aes_mbs_in_locale.buffer_length = 0;
    mstr.aes_set = L'\0';
    mstr._100_4_ = 0;
    pFVar5 = (FILE *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǫ',(uint)(pFVar5 != (FILE *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    paVar8 = archive_string_conversion_from_charset((archive_conflict *)pFVar5,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǭ',(uint)(paVar8 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     pFVar5);
    paVar4 = (archive_conflict *)
             archive_string_conversion_from_charset((archive_conflict *)pFVar5,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǯ',(uint)(paVar4 != (archive_conflict *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,pFVar5);
    paVar10 = (archive_conflict *)
              archive_string_conversion_from_charset((archive_conflict *)pFVar5,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǰ',(uint)(paVar10 != (archive_conflict *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,pFVar5);
    a = (archive_conflict *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǳ',(uint)(a != (archive_conflict *)0x0),
                     "(a2 = archive_write_new()) != NULL",(void *)0x0);
    paVar9 = archive_string_conversion_to_charset(a,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ǳ',(uint)(paVar9 != (archive_string_conv *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,pFVar5);
    auVar16._0_4_ = -(uint)((int)((ulong)paVar8 >> 0x20) == 0 && (int)paVar8 == 0);
    auVar16._4_4_ = -(uint)((int)paVar4 == 0 && (int)((ulong)paVar4 >> 0x20) == 0);
    auVar16._8_4_ = -(uint)((int)((ulong)paVar10 >> 0x20) == 0 && (int)paVar10 == 0);
    auVar16._12_4_ = -(uint)((int)paVar9 == 0 && (int)((ulong)paVar9 >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar16);
    if (iVar1 == 0) {
      local_8c0 = paVar8;
      archive_string_conversion_set_opt(paVar8,L'\x04');
      local_8b0 = paVar4;
      archive_string_conversion_set_opt((archive_string_conv *)paVar4,L'\x04');
      local_8a0 = paVar10;
      archive_string_conversion_set_opt((archive_string_conv *)paVar10,L'\x04');
      local_890 = paVar9;
      archive_string_conversion_set_opt(paVar9,L'\x04');
      local_8a8 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'Ȁ',(uint)(local_8a8 != (FILE *)0x0),
                       "(fp = fopen(testdata, \"r\")) != NULL",(void *)0x0);
      uVar14 = 1;
      local_8b8 = pFVar5;
      while( true ) {
        pFVar5 = local_8b8;
        pcVar7 = utf8_nfd;
        pcVar11 = fgets(buff_1,0x200,local_8a8);
        if (pcVar11 == (char *)0x0) break;
        if (buff_1[0] != '#') {
          pcVar11 = strchr(buff_1,0x3b);
          if (pcVar11 != (char *)0x0) {
            *pcVar11 = '\0';
            strncpy(nfc,buff_1,0x4f);
            nfc[0x4f] = '\0';
            pcVar12 = strchr(pcVar11 + 1,10);
            if (pcVar12 != (char *)0x0) {
              *pcVar12 = '\0';
              strncpy(nfd,pcVar11 + 1,0x4f);
              nfd[0x4f] = '\0';
              wVar2 = scan_unicode_pattern(utf8_nfc,wc_nfc,utf16be_nfc,utf16le_nfc,nfc,L'\x01');
              scan_unicode_pattern(pcVar7,wc_nfd,utf16be_nfd,utf16le_nfd,nfd,L'\0');
              sVar6 = strlen(utf8_nfc);
              wVar3 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ȹ',0,"0",(long)wVar3,
                                  "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
              local_8c8 = (archive_string_conv *)CONCAT44(local_8c8._4_4_,wVar2);
              if (wVar2 == L'\0') {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,(ulong)uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ɂ',pcVar7,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,(ulong)uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ƚ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              sVar6 = strlen(pcVar7);
              wVar2 = archive_strncpy_l(&local_8e8,pcVar7,sVar6,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɉ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
              failure("NFD(%s) should not be any changed:%d",nfd,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ɋ',pcVar7,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(pcVar7);
              wVar2 = archive_strncpy_l(&local_8e8,pcVar7,sVar6,local_890);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɑ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, t_sconv8)",(void *)0x0);
              failure("NFD(%s) should not be any changed:%d",nfd,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ɔ',pcVar7,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16be_nfc,100000,
                                        (archive_string_conv *)local_8b0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɚ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16be_nfc, 100000, f_sconv16be)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,uVar14);
                wVar2 = L'ɢ';
                pcVar11 = "utf8_nfd";
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,uVar14);
                wVar2 = L'ɞ';
                pcVar7 = utf8_nfc;
                pcVar11 = "utf8_nfc";
              }
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pcVar7,pcVar11,local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16le_nfc,100000,
                                        (archive_string_conv *)local_8a0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɩ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16le_nfc, 100000, f_sconv16le)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɱ',utf8_nfd,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,uVar14);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɭ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf8_nfc,100000,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʁ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfc, 100000, f_sconv8)"
                                  ,(void *)0x0);
              pFVar5 = local_8b8;
              wVar2 = archive_mstring_get_wcs((archive_conflict *)local_8b8,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʃ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("UTF-8 NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,uVar14);
                wVar2 = L'ʋ';
                pwVar13 = wc_nfd;
                pcVar7 = "wc_nfd";
              }
              else {
                failure("UTF-8 NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,uVar14);
                wVar2 = L'ʇ';
                pwVar13 = wc_nfc;
                pcVar7 = "wc_nfc";
              }
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pwVar13,pcVar7,wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16be_nfc,100000,(archive_string_conv *)local_8b0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʒ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfc, 100000, f_sconv16be)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs((archive_conflict *)pFVar5,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʔ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("UTF-16BE NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,uVar14);
                wVar2 = L'ʝ';
                pwVar13 = wc_nfd;
                pcVar7 = "wc_nfd";
              }
              else {
                failure("UTF-16BE NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,uVar14)
                ;
                wVar2 = L'ʙ';
                pwVar13 = wc_nfc;
                pcVar7 = "wc_nfc";
              }
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pwVar13,pcVar7,wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16le_nfc,100000,(archive_string_conv *)local_8a0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʤ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfc, 100000, f_sconv16le)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs((archive_conflict *)pFVar5,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʦ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("UTF-16LE NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,uVar14);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʯ',wc_nfd,"wc_nfd",wp,"wp",(void *)0x0);
              }
              else {
                failure("UTF-16LE NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)uVar14);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʫ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              }
              wVar2 = archive_mstring_copy_wcs(&mstr,wc_nfd);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʶ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_wcs( &mstr, wc_nfd)",(void *)0x0);
              wVar2 = archive_mstring_get_mbs_l
                                ((archive_conflict *)local_8b8,&mstr,&mp,&local_830,local_890);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʸ',0,"0",(long)wVar2,
                                  "archive_mstring_get_mbs_l( a, &mstr, &mp, &mplen, t_sconv8)",
                                  (void *)0x0);
              failure("WCS NFD(%s) should be UTF-8 NFD:%d",nfd,(ulong)uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ʻ',utf8_nfd,"utf8_nfd",mp,"mp",(void *)0x0,L'\x01');
            }
          }
        }
        uVar14 = uVar14 + 1;
      }
      archive_string_free(&local_8e8);
      archive_mstring_clean(&mstr);
      fclose(local_8a8);
      iVar1 = archive_read_free((archive *)pFVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'˂',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free((archive *)a);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'˃';
    }
    else {
      iVar1 = archive_read_free((archive *)pFVar5);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ƿ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  setlocale(6,"en_US.UTF-8");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˎ',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˑ',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4)
  ;
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˔',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˗',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˚',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˝',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˠ',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˣ',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˦',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˩',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˬ',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf16be",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˯',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16be\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˲',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˵',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˸',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˻',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˾',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf16le",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'́',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16le\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̄',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̆',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  setlocale(6,"en_US.UTF-8");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̼',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  buff_1[0] = '\0';
  buff_1[1] = '\0';
  buff_1[2] = '\0';
  buff_1[3] = '\0';
  buff_1[4] = '\0';
  buff_1[5] = '\0';
  buff_1[6] = '\0';
  buff_1[7] = '\0';
  buff_1[8] = '\0';
  buff_1[9] = '\0';
  buff_1[10] = '\0';
  buff_1[0xb] = '\0';
  buff_1[0xc] = '\0';
  buff_1[0xd] = '\0';
  buff_1[0xe] = '\0';
  buff_1[0xf] = '\0';
  buff_1[0x10] = '\0';
  buff_1[0x11] = '\0';
  buff_1[0x12] = '\0';
  buff_1[0x13] = '\0';
  buff_1[0x14] = '\0';
  buff_1[0x15] = '\0';
  buff_1[0x16] = '\0';
  buff_1[0x17] = '\0';
  buff_1[0x18] = '\0';
  buff_1[0x19] = '\0';
  buff_1[0x1a] = '\0';
  buff_1[0x1b] = '\0';
  buff_1[0x1c] = '\0';
  buff_1[0x1d] = '\0';
  buff_1[0x1e] = '\0';
  buff_1[0x1f] = '\0';
  buff_1[0x20] = '\0';
  buff_1[0x21] = '\0';
  buff_1[0x22] = '\0';
  buff_1[0x23] = '\0';
  buff_1[0x24] = '\0';
  buff_1[0x25] = '\0';
  buff_1[0x26] = '\0';
  buff_1[0x27] = '\0';
  buff_1[0x28] = '\0';
  buff_1[0x29] = '\0';
  buff_1[0x2a] = '\0';
  buff_1[0x2b] = '\0';
  buff_1[0x2c] = '\0';
  buff_1[0x2d] = '\0';
  buff_1[0x2e] = '\0';
  buff_1[0x2f] = '\0';
  buff_1[0x30] = '\0';
  buff_1[0x31] = '\0';
  buff_1[0x32] = '\0';
  buff_1[0x33] = '\0';
  buff_1[0x34] = '\0';
  buff_1[0x35] = '\0';
  buff_1[0x36] = '\0';
  buff_1[0x37] = '\0';
  buff_1[0x38] = '\0';
  buff_1[0x39] = '\0';
  buff_1[0x3a] = '\0';
  buff_1[0x3b] = '\0';
  buff_1[0x3c] = '\0';
  buff_1[0x3d] = '\0';
  buff_1[0x3e] = '\0';
  buff_1[0x3f] = '\0';
  buff_1[0x40] = '\0';
  buff_1[0x41] = '\0';
  buff_1[0x42] = '\0';
  buff_1[0x43] = '\0';
  buff_1[0x44] = '\0';
  buff_1[0x45] = '\0';
  buff_1[0x46] = '\0';
  buff_1[0x47] = '\0';
  buff_1[0x48] = '\0';
  buff_1[0x49] = '\0';
  buff_1[0x4a] = '\0';
  buff_1[0x4b] = '\0';
  buff_1[0x4c] = '\0';
  buff_1[0x4d] = '\0';
  buff_1[0x4e] = '\0';
  buff_1[0x4f] = '\0';
  buff_1[0x50] = '\0';
  buff_1[0x51] = '\0';
  buff_1[0x52] = '\0';
  buff_1[0x53] = '\0';
  buff_1[0x54] = '\0';
  buff_1[0x55] = '\0';
  buff_1[0x56] = '\0';
  buff_1[0x57] = '\0';
  buff_1[0x58] = '\0';
  buff_1[0x59] = '\0';
  buff_1[0x5a] = '\0';
  buff_1[0x5b] = '\0';
  buff_1[0x5c] = '\0';
  buff_1[0x5d] = '\0';
  buff_1[0x5e] = '\0';
  buff_1[0x5f] = '\0';
  buff_1[0x60] = '\0';
  buff_1[0x61] = '\0';
  buff_1[0x62] = '\0';
  buff_1[99] = '\0';
  buff_1[100] = '\0';
  buff_1[0x65] = '\0';
  buff_1[0x66] = '\0';
  buff_1[0x67] = '\0';
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̀',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sc = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̓',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sc)",
             (void *)0x0,L'\0');
  wVar2 = archive_mstring_copy_mbs((archive_mstring *)buff_1,"AAA");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͅ',0,"0",(long)wVar2,"archive_mstring_copy_mbs(&mstr, \"AAA\")",
                      (void *)0x0);
  check_string((archive *)paVar4,(archive_mstring *)buff_1,paVar8,"AAA",L"AAA");
  wVar2 = archive_mstring_copy_utf8((archive_mstring *)buff_1,"BBBB");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͇',4,"4",(long)wVar2,"archive_mstring_copy_utf8(&mstr, \"BBBB\")",
                      (void *)0x0);
  check_string((archive *)paVar4,(archive_mstring *)buff_1,paVar8,"BBBB",L"BBBB");
  wVar2 = archive_mstring_copy_wcs((archive_mstring *)buff_1,L"CCC12");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͉',0,"0",(long)wVar2,"archive_mstring_copy_wcs(&mstr, L\"CCC12\")",
                      (void *)0x0);
  check_string((archive *)paVar4,(archive_mstring *)buff_1,paVar8,"CCC12",L"CCC12");
  wVar2 = archive_mstring_copy_mbs_len_l((archive_mstring *)buff_1,"DDDD-l",6,paVar8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͋',0,"0",(long)wVar2,
                      "archive_mstring_copy_mbs_len_l(&mstr, \"DDDD-l\", 6, sc)",(void *)0x0);
  check_string((archive *)paVar4,(archive_mstring *)buff_1,paVar8,"DDDD-l",L"DDDD-l");
  wVar2 = archive_mstring_update_utf8(paVar4,(archive_mstring *)buff_1,"EEEEE---H");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͍',0,"0",(long)wVar2,
                      "archive_mstring_update_utf8(a, &mstr, \"EEEEE---H\")",(void *)0x0);
  check_string((archive *)paVar4,(archive_mstring *)buff_1,paVar8,"EEEEE---H",L"EEEEE---H");
  archive_mstring_clean((archive_mstring *)buff_1);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͑',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		assertEqualInt(size, fwrite(buff, 1, size, fp));
	assertEqualInt(0, fclose(fp));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
	test_archive_string_set_get();
}